

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_normdev(REF_CAVITY ref_cavity,REF_BOOL *improved)

{
  REF_GRID ref_grid;
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  bool bVar2;
  uint uVar3;
  REF_STATUS RVar4;
  REF_LIST pRVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  REF_DBL uv_area;
  REF_DBL sign_uv_area;
  REF_DBL normdev;
  REF_INT nodes [27];
  undefined4 local_118;
  undefined4 uStack_114;
  double local_100;
  double local_f8;
  double local_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  REF_GEOM local_d0;
  double local_c8;
  undefined8 uStack_c0;
  REF_NODE local_b8;
  uint *local_b0;
  REF_INT local_a8 [2];
  int local_a0;
  REF_INT local_9c;
  
  ref_grid = ref_cavity->ref_grid;
  iVar9 = ref_cavity->surf_node;
  if (iVar9 == -1) {
    iVar9 = ref_cavity->node;
  }
  local_b8 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  local_d0 = ref_grid->geom;
  *improved = 1;
  pRVar5 = ref_cavity->tri_list;
  local_b0 = (uint *)improved;
  if (pRVar5->n < 1) {
    local_e8 = 0;
    uStack_e4 = 0x40000000;
    uStack_e0 = 0;
    uStack_dc = 0;
    local_118 = 0xd7d7625a;
    uStack_114 = 0x6974e718;
  }
  else {
    local_118 = 0xd7d7625a;
    uStack_114 = 0x6974e718;
    local_e8 = 0;
    uStack_e4 = 0x40000000;
    uStack_e0 = 0;
    uStack_dc = 0;
    lVar7 = 0;
    do {
      uVar3 = ref_cell_nodes(ref_cell,pRVar5->value[lVar7],local_a8);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x995,"ref_cavity_normdev",(ulong)uVar3,"cell");
        return uVar3;
      }
      uVar3 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_f0);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x997,"ref_cavity_normdev",(ulong)uVar3,"old tri normdev");
        return uVar3;
      }
      if (local_f0 <= (double)CONCAT44(uStack_e4,local_e8)) {
        local_e8 = SUB84(local_f0,0);
        uStack_e4 = (undefined4)((ulong)local_f0 >> 0x20);
      }
      if (local_d0->meshlink == (void *)0x0) {
        uVar3 = ref_geom_uv_area(local_d0,local_a8,&local_100);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x99a,"ref_cavity_normdev",(ulong)uVar3,"uv area");
          return uVar3;
        }
        uVar3 = ref_geom_uv_area_sign(ref_grid,local_9c,&local_f8);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x99b,"ref_cavity_normdev",(ulong)uVar3,"sign");
          return uVar3;
        }
        local_100 = local_f8 * local_100;
        dVar12 = (double)CONCAT44(uStack_114,local_118);
        if (local_100 <= (double)CONCAT44(uStack_114,local_118)) {
          dVar12 = local_100;
        }
        local_118 = SUB84(dVar12,0);
        uStack_114 = (undefined4)((ulong)dVar12 >> 0x20);
      }
      lVar7 = lVar7 + 1;
      pRVar5 = ref_cavity->tri_list;
    } while (lVar7 < pRVar5->n);
  }
  if (ref_cavity->debug != 0) {
    printf("- min %12.8f %12.8f\n",local_e8,CONCAT44(uStack_114,local_118));
  }
  if (ref_cavity->maxseg < 1) {
    uVar10 = 0;
    uVar11 = 0x40000000;
    local_c8 = 1e+200;
    uStack_c0 = 0;
  }
  else {
    local_c8 = 1e+200;
    uStack_c0 = 0;
    uVar10 = 0;
    uVar11 = 0x40000000;
    lVar7 = 0;
    lVar8 = 0;
    do {
      pRVar1 = ref_cavity->s2n;
      if (pRVar1[lVar8 * 3] != -1) {
        lVar6 = 0;
        bVar2 = false;
        do {
          if (iVar9 == *(int *)((long)pRVar1 + lVar6 * 4 + lVar7)) {
            bVar2 = true;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 == 1);
        if (!bVar2) {
          lVar6 = 0;
          do {
            local_a8[lVar6] = *(REF_INT *)((long)pRVar1 + lVar6 * 4 + lVar7);
            lVar6 = lVar6 + 1;
          } while (lVar6 == 1);
          local_9c = pRVar1[lVar8 * 3 + 2];
          local_a0 = iVar9;
          RVar4 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_f0);
          if (RVar4 != 0) {
            uVar3 = 0;
            goto LAB_0017da8c;
          }
          if (local_f0 <= (double)CONCAT44(uVar11,uVar10)) {
            uVar10 = SUB84(local_f0,0);
            uVar11 = (undefined4)((ulong)local_f0 >> 0x20);
          }
          if (local_d0->meshlink == (void *)0x0) {
            uVar3 = ref_geom_uv_area(local_d0,local_a8,&local_100);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x9bb,"ref_cavity_normdev",(ulong)uVar3,"uv area");
              return uVar3;
            }
            uVar3 = ref_geom_uv_area_sign(ref_grid,local_9c,&local_f8);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x9bc,"ref_cavity_normdev",(ulong)uVar3,"sign");
              return uVar3;
            }
            local_100 = local_f8 * local_100;
            if (local_100 <= local_c8) {
              local_c8 = local_100;
            }
          }
        }
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0xc;
    } while (lVar8 < ref_cavity->maxseg);
  }
  if (ref_cavity->debug != 0) {
    printf("+ min %12.8f %12.8f\n",uVar10);
  }
  uVar3 = -(uint)((double)CONCAT44(uStack_e4,local_e8) < (double)CONCAT44(uVar11,uVar10) &&
                 local_b8->min_uv_area < local_c8) & 1;
LAB_0017da8c:
  *local_b0 = uVar3;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_normdev(REF_CAVITY ref_cavity,
                                      REF_BOOL *improved) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT node;
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL normdev, min_normdev, old_normdev;
  REF_DBL sign_uv_area, uv_area, min_uv_area;
  REF_INT seg, seg_node;
  REF_BOOL skip;

  node = ref_cavity_seg_node(ref_cavity);

  *improved = REF_TRUE;

  min_normdev = 2.0;
  min_uv_area = REF_DBL_MAX;
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell");
    RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev),
        "old tri normdev");
    min_normdev = MIN(min_normdev, normdev);
    if (!ref_geom_meshlinked(ref_geom)) {
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area *= sign_uv_area;
      min_uv_area = MIN(min_uv_area, uv_area);
    }
  }
  old_normdev = min_normdev;

  if (ref_cavity_debug(ref_cavity))
    printf("- min %12.8f %12.8f\n", min_normdev, min_uv_area);

  min_normdev = 2.0;
  min_uv_area = REF_DBL_MAX;
  each_ref_cavity_valid_seg(ref_cavity, seg) {
    skip = REF_FALSE;
    /* skip a collapsed triangle that in on the boundary of cavity */
    each_ref_cavity_seg_node(ref_cavity, seg_node) {
      if (node == ref_cavity_s2n(ref_cavity, seg_node, seg)) {
        skip = REF_TRUE;
      }
    }
    if (skip) continue;
    each_ref_cavity_seg_node(ref_cavity, seg_node) {
      nodes[seg_node] = ref_cavity_s2n(ref_cavity, seg_node, seg);
    }
    nodes[2] = node;
    nodes[3] = ref_cavity_s2n(ref_cavity, 2, seg);
    if (REF_SUCCESS != ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev)) {
      *improved = REF_FALSE;
      return REF_SUCCESS;
    }
    min_normdev = MIN(min_normdev, normdev);
    if (!ref_geom_meshlinked(ref_geom)) {
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area *= sign_uv_area;
      min_uv_area = MIN(min_uv_area, uv_area);
    }
  }
  if (ref_cavity_debug(ref_cavity))
    printf("+ min %12.8f %12.8f\n", min_normdev, min_uv_area);

  *improved = (min_uv_area > ref_node_min_uv_area(ref_node) &&
               min_normdev > old_normdev);

  return REF_SUCCESS;
}